

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O0

void nhr_request_wait_raw_response(nhr_request_conflict r)

{
  nhr_bool nVar1;
  nhr_bool is_finished;
  nhr_request_conflict r_local;
  
  nVar1 = nhr_request_recv(r);
  if (nVar1 == '\0') {
    if (r == (nhr_request_conflict)0x0) {
      uRam0000000000000048 = 2;
      nhr_request_set_command((nhr_request_conflict)0x0,6);
    }
    else {
      nhr_request_set_command(r,5);
    }
  }
  else {
    if (r->response == (nhr_response)0x0) {
      nVar1 = '\0';
    }
    else {
      nVar1 = r->response->is_finished;
    }
    if (nVar1 != '\0') {
      nhr_request_set_command(r,5);
    }
    nhr_request_check_timeout(r);
  }
  return;
}

Assistant:

void nhr_request_wait_raw_response(nhr_request r) {
	nhr_bool is_finished = nhr_false;
	if (nhr_request_recv(r)) {
		is_finished = r->response ? r->response->is_finished : nhr_false;
		if (is_finished) {
			nhr_request_set_command(r, NHR_COMMAND_INFORM_RESPONSE);
		}
		if (!nhr_request_check_timeout(r)) {
			return; // error already exists
		}
	} else if (r) {
		nhr_request_set_command(r, NHR_COMMAND_INFORM_RESPONSE);
	} else {
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	}
}